

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::UniformValue::UniformValue
          (UniformValue *this,UniformType *_type,UniformValueGenerator *generator)

{
  uint uVar1;
  GLenum GVar2;
  pair<int,_int> pVar3;
  pointer pfVar4;
  pointer piVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  float fVar13;
  
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&this->type,_type);
  pVar3 = (this->type).size;
  GVar2 = (this->type).baseType;
  iVar6 = pVar3.second;
  iVar11 = pVar3.first;
  if ((int)GVar2 < 0x1405) {
    if (GVar2 != 0) {
      if (GVar2 != 0x1404) {
LAB_00bc45c8:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x28c,
                      "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                     );
      }
      if (iVar6 != 1) {
        __assert_fail("sizeColumn == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x263,
                      "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                     );
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&this->iValues,(long)((this->type).arraySize * iVar11));
      piVar5 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)(this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar5;
      if (lVar7 != 0) {
        lVar7 = lVar7 >> 2;
        lVar10 = 0;
        do {
          iVar11 = generator->iValue + 1;
          generator->iValue = iVar11;
          piVar5[lVar10] = iVar11;
          lVar10 = lVar10 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar10);
      }
    }
  }
  else if (GVar2 == 0x1405) {
    if (iVar6 != 1) {
      __assert_fail("sizeColumn == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                    ,0x26c,
                    "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                   );
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&this->uValues,(long)((this->type).arraySize * iVar11));
    piVar5 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 2;
      lVar10 = 0;
      do {
        iVar11 = generator->iValue + 1;
        generator->iValue = iVar11;
        piVar5[lVar10] = iVar11;
        lVar10 = lVar10 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar10);
    }
  }
  else if (GVar2 == 0x1406) {
    std::vector<float,_std::allocator<float>_>::resize
              (&this->fValues,(long)(iVar6 * iVar11 * (this->type).arraySize));
    pfVar4 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar4;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 2;
      lVar10 = 0;
      do {
        if (99999.0 < generator->fValue) {
          generator->fValue = 0.0;
        }
        fVar13 = generator->fValue + 1.0;
        generator->fValue = fVar13;
        pfVar4[lVar10] = fVar13;
        lVar10 = lVar10 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar10);
    }
  }
  else {
    if (GVar2 != 0x82e6) goto LAB_00bc45c8;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->fValues,(long)((this->type).arraySize << 2));
    pfVar4 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar4;
    if (lVar7 != 0) {
      uVar8 = lVar7 >> 2;
      uVar9 = 0;
      do {
        pfVar4[uVar9] = (float)uVar9 / (float)uVar8;
        uVar9 = uVar9 + 1;
      } while (uVar8 + (uVar8 == 0) != uVar9);
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->iValues,(long)(this->type).arraySize);
    piVar5 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 2;
      lVar10 = 0;
      do {
        iVar11 = generator->iValue;
        uVar1 = iVar11 + 1;
        generator->iValue = uVar1;
        uVar12 = iVar11 + 0x10;
        if (-1 < (int)uVar1) {
          uVar12 = uVar1;
        }
        piVar5[lVar10] = (iVar11 - (uVar12 & 0xfffffff0)) + 1;
        lVar10 = lVar10 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar10);
    }
  }
  return;
}

Assistant:

UniformValue(const UniformType& _type, UniformValueGenerator& generator) : type(_type)
	{
		const int sizeRow	= type.getSize().first;
		const int sizeColumn = type.getSize().second;

		if (type.isStruct())
		{
			return;
		}

		if (type.getBaseType() == GL_INT)
		{
			assert(sizeColumn == 1);
			iValues.resize(sizeRow * type.arraySize);
			for (size_t elem = 0; elem < iValues.size(); elem++)
			{
				iValues[elem] = generator.genI();
			}
		}
		else if (type.getBaseType() == GL_UNSIGNED_INT)
		{
			assert(sizeColumn == 1);
			uValues.resize(sizeRow * type.arraySize);
			for (size_t elem = 0; elem < uValues.size(); elem++)
			{
				uValues[elem] = static_cast<GLuint>(generator.genI());
			}
		}
		else if (type.getBaseType() == GL_FLOAT)
		{
			fValues.resize(sizeColumn * sizeRow * type.arraySize);
			for (size_t elem = 0; elem < fValues.size(); elem++)
			{
				fValues[elem] = generator.genF();
			}
		}
		else if (type.getBaseType() == GL_SAMPLER)
		{
			//color ref value
			fValues.resize(4 * type.arraySize);
			for (size_t elem = 0; elem < fValues.size(); elem++)
			{
				fValues[elem] = float(elem) / float(fValues.size());
			}
			//uniform value
			iValues.resize(type.arraySize);
			for (size_t elem = 0; elem < iValues.size(); elem++)
			{
				iValues[elem] = generator.genI() % 16;
			}
		}
		else
		{
			assert(0);
		}
	}